

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O3

bool __thiscall
EthBasePort::WriteBlockNode
          (EthBasePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t *wdata,uint nbytes,uchar flags)

{
  uchar *puVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  undefined6 in_register_00000032;
  uchar *puVar8;
  long *local_50 [2];
  long local_40 [2];
  
  if ((int)CONCAT62(in_register_00000032,node) != 0x3f) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"WriteBlock","");
    iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,(string *)local_50,0);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if ((char)iVar2 == '\0') {
      return false;
    }
  }
  BasePort::SetGenericBuffer(&this->super_BasePort);
  puVar8 = (this->super_BasePort).GenericBuffer;
  uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x17])(this);
  iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,2);
  iVar4 = (*(this->super_BasePort)._vptr_BasePort[0x15])(this);
  uVar7 = (ulong)(iVar4 + iVar2 + nbytes);
  uVar5 = (*(this->super_BasePort)._vptr_BasePort[0x17])(this);
  uVar6 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,2);
  puVar1 = (this->super_BasePort).WriteBufferBroadcast;
  if ((uchar *)((long)wdata + (-(ulong)uVar6 - (ulong)uVar5)) == puVar1) {
    uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x17])(this);
    puVar8 = puVar1 + uVar3;
  }
  else {
    puVar8 = puVar8 + uVar3;
  }
  this->fw_tl = this->fw_tl + 1 & 0x3f;
  (*(this->super_BasePort)._vptr_BasePort[0x31])(this,puVar8,uVar7,(ulong)node,flags);
  uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,0);
  puVar8[uVar3] = '\0';
  if (((flags & 0x40) != 0) || (this->useFwBridge == false)) {
    puVar8[uVar3] = '\x01';
  }
  puVar8[uVar3 + 1] = (uchar)(this->super_BasePort).FwBusGeneration;
  uVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
  make_bwrite_packet(this,(quadlet_t *)(puVar8 + uVar3),node,addr,wdata,nbytes,(uint)this->fw_tl);
  iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x2d])
                    (this,(ulong)node,puVar8,uVar7,(ulong)(flags >> 7));
  return (bool)(char)iVar2;
}

Assistant:

bool EthBasePort::WriteBlockNode(nodeid_t node, nodeaddr_t addr, quadlet_t *wdata,
                                 unsigned int nbytes, unsigned char flags)
{
    if ((node != FW_NODE_BROADCAST) && !CheckFwBusGeneration("WriteBlock"))
        return false;

    // Packet to send
    SetGenericBuffer();   // Make sure buffer is allocated
    unsigned char *packet = GenericBuffer+GetWriteQuadAlign();
    size_t packetSize = GetPrefixOffset(WR_FW_BDATA) + nbytes + GetWritePostfixSize();

    // Check for real-time write
    unsigned char *wdata_base = reinterpret_cast<unsigned char *>(wdata)-GetWriteQuadAlign()-GetPrefixOffset(WR_FW_BDATA);
    if (wdata_base == WriteBufferBroadcast) {
        packet = WriteBufferBroadcast+GetWriteQuadAlign();
    }

    // Increment transaction label
    fw_tl = (fw_tl+1)&FW_TL_MASK;

    // Make Ethernet header (only needed for raw Ethernet)
    make_ethernet_header(packet, packetSize, node, flags);

    // Make control word
    make_write_header(packet, packetSize, flags);

    // Build FireWire packet
    make_bwrite_packet(reinterpret_cast<quadlet_t *>(packet+GetPrefixOffset(WR_FW_HEADER)), node, addr, wdata, nbytes, fw_tl);

    // Now, send the packet
    return PacketSend(node, packet, packetSize, flags&FW_NODE_ETH_BROADCAST_MASK);
}